

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.h
# Opt level: O2

bool __thiscall Kumu::Identifier<16U>::operator<(Identifier<16U> *this,Identifier<16U> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    uVar2 = uVar1;
    if (uVar1 == 0x10) goto LAB_00192ca0;
    uVar2 = uVar1 + 1;
  } while (this->m_Value[uVar1] == rhs->m_Value[uVar1]);
  uVar2 = (ulong)(this->m_Value[uVar1] < rhs->m_Value[uVar1]);
LAB_00192ca0:
  return (bool)(uVar1 < 0x10 & (byte)uVar2);
}

Assistant:

inline bool operator<(const Identifier& rhs) const {
	ui32_t test_size = xmin(rhs.Size(), SIZE);

	for ( ui32_t i = 0; i < test_size; i++ )
	  {
	    if ( m_Value[i] != rhs.m_Value[i] )
	      return m_Value[i] < rhs.m_Value[i];
	  }
	
	return false;
      }